

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cc
# Opt level: O3

ostream * operator<<(ostream *out,Node *node)

{
  Node *pNVar1;
  ostream *poVar2;
  
  for (pNVar1 = (Node *)(node->thesteps).
                        super__List_base<const_Operation_*,_std::allocator<const_Operation_*>_>.
                        _M_impl._M_node.super__List_node_base._M_next; pNVar1 != node;
      pNVar1 = (Node *)(pNVar1->thesteps).
                       super__List_base<const_Operation_*,_std::allocator<const_Operation_*>_>.
                       _M_impl._M_node.super__List_node_base._M_next) {
    poVar2 = operator<<(out,(Operation *)
                            (pNVar1->thesteps).
                            super__List_base<const_Operation_*,_std::allocator<const_Operation_*>_>.
                            _M_impl._M_node._M_size);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  return out;
}

Assistant:

ostream &operator<<(ostream &out, const Node &node)
{
	typedef list<const Operation *>::const_iterator iter;
	const list<const Operation *>&steps = node.steps();
	for (iter ii = steps.begin(); ii != steps.end(); ++ii)
		out << *(*ii) << endl;
	return out;
}